

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawRectangleLines(int posX,int posY,int width,int height,Color color)

{
  float fVar1;
  float x;
  float x_00;
  float y;
  float y_00;
  Matrix mat;
  
  rlGetMatrixModelview();
  fVar1 = 0.5 / mat.m0;
  rlBegin(1);
  rlColor4ub(color.r,color.g,color.b,color.a);
  x = (float)posX;
  y_00 = (float)posY;
  rlVertex2f(x - fVar1,y_00);
  x_00 = (float)width + x;
  rlVertex2f(x_00 + fVar1,y_00);
  rlVertex2f(x_00,y_00 - fVar1);
  y = (float)height + y_00;
  rlVertex2f(x_00,fVar1 + y);
  rlVertex2f(x_00 + fVar1,y);
  rlVertex2f(x - fVar1,y);
  rlVertex2f(x,fVar1 + y);
  rlVertex2f(x,y_00 - fVar1);
  rlEnd();
  return;
}

Assistant:

void DrawRectangleLines(int posX, int posY, int width, int height, Color color)
{
    Matrix mat = rlGetMatrixModelview();
    float zoomFactor = 0.5f/mat.m0;
    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f((float)posX - zoomFactor, (float)posY);
        rlVertex2f((float)posX + (float)width + zoomFactor, (float)posY);

        rlVertex2f((float)posX + (float)width, (float)posY - zoomFactor);
        rlVertex2f((float)posX + (float)width, (float)posY + (float)height + zoomFactor);

        rlVertex2f((float)posX + (float)width + zoomFactor, (float)posY + (float)height);
        rlVertex2f((float)posX - zoomFactor, (float)posY + (float)height);

        rlVertex2f((float)posX, (float)posY + (float)height + zoomFactor);
        rlVertex2f((float)posX, (float)posY - zoomFactor);
    rlEnd();
/*
// Previous implementation, it has issues... but it does not require view matrix...
#if defined(SUPPORT_QUADS_DRAW_MODE)
    DrawRectangle(posX, posY, width, 1, color);
    DrawRectangle(posX + width - 1, posY + 1, 1, height - 2, color);
    DrawRectangle(posX, posY + height - 1, width, 1, color);
    DrawRectangle(posX, posY + 1, 1, height - 2, color);
#else
    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f((float)posX, (float)posY);
        rlVertex2f((float)posX + (float)width, (float)posY + 1);

        rlVertex2f((float)posX + (float)width, (float)posY + 1);
        rlVertex2f((float)posX + (float)width, (float)posY + (float)height);

        rlVertex2f((float)posX + (float)width, (float)posY + (float)height);
        rlVertex2f((float)posX + 1, (float)posY + (float)height);

        rlVertex2f((float)posX + 1, (float)posY + (float)height);
        rlVertex2f((float)posX + 1, (float)posY + 1);
    rlEnd();
//#endif
*/
}